

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmGetPropertyCommand::HandleTargetMode(cmGetPropertyCommand *this)

{
  bool bVar1;
  int iVar2;
  TargetType tgtType;
  cmTarget *this_00;
  cmMessenger *messenger;
  char *value;
  string *psVar3;
  ostream *poVar4;
  pointer value_00;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  if ((this->Name)._M_string_length == 0) {
    local_198._0_8_ = local_188;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"not given name for TARGET scope.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != local_188) {
      operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
    }
  }
  else {
    this_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,&this->Name,false);
    if (this_00 != (cmTarget *)0x0) {
      psVar3 = &this->PropertyName;
      iVar2 = std::__cxx11::string::compare((char *)psVar3);
      if (iVar2 == 0) {
        bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,&this->Name);
        if (bVar1) {
          psVar3 = cmTarget::GetName_abi_cxx11_(this_00);
          value_00 = (psVar3->_M_dataplus)._M_p;
        }
        else {
          value_00 = (char *)0x0;
        }
        StoreResult(this,value_00);
      }
      else {
        cmMakefile::GetBacktrace((this->super_cmCommand).Makefile);
        messenger = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
        tgtType = cmTarget::GetType(this_00);
        bVar1 = cmTargetPropertyComputer::PassesWhitelist
                          (tgtType,psVar3,messenger,(cmListFileBacktrace *)local_198);
        if (bVar1) {
          value = cmTarget::GetComputedProperty
                            (this_00,psVar3,messenger,(cmListFileBacktrace *)local_198);
          if (value == (char *)0x0) {
            value = cmTarget::GetProperty(this_00,psVar3);
          }
        }
        else {
          value = (char *)0x0;
        }
        StoreResult(this,value);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
      }
      if (this_00 != (cmTarget *)0x0) {
        return true;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"could not find TARGET ",0x16);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(this->Name)._M_dataplus._M_p,
                        (this->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,".  Perhaps it has not yet been created.",0x27);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
  return false;
}

Assistant:

bool cmGetPropertyCommand::HandleTargetMode()
{
  if (this->Name.empty()) {
    this->SetError("not given name for TARGET scope.");
    return false;
  }

  if (cmTarget* target = this->Makefile->FindTargetToUse(this->Name)) {
    if (this->PropertyName == "ALIASED_TARGET") {
      if (this->Makefile->IsAlias(this->Name)) {
        return this->StoreResult(target->GetName().c_str());
      }
      return this->StoreResult(nullptr);
    }
    const char* prop_cstr = nullptr;
    cmListFileBacktrace bt = this->Makefile->GetBacktrace();
    cmMessenger* messenger = this->Makefile->GetMessenger();
    if (cmTargetPropertyComputer::PassesWhitelist(
          target->GetType(), this->PropertyName, messenger, bt)) {
      prop_cstr =
        target->GetComputedProperty(this->PropertyName, messenger, bt);
      if (!prop_cstr) {
        prop_cstr = target->GetProperty(this->PropertyName);
      }
    }
    return this->StoreResult(prop_cstr);
  }
  std::ostringstream e;
  e << "could not find TARGET " << this->Name
    << ".  Perhaps it has not yet been created.";
  this->SetError(e.str());
  return false;
}